

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynCallArgument * ParseCallArgument(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  SynIdentifier *this;
  Lexeme *pLVar2;
  SynCallArgument *this_00;
  SynBase *value_00;
  Lexeme *pLVar3;
  InplaceStr name_00;
  SynBase *value_1;
  SynBase *value;
  SynIdentifier *nameIdentifier;
  InplaceStr name;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::At(ctx,lex_string);
  if (bVar1) {
    name_00 = ParseContext::Consume(ctx);
    this = ParseContext::get<SynIdentifier>(ctx);
    pLVar3 = ParseContext::Previous(ctx);
    pLVar2 = ParseContext::Previous(ctx);
    SynIdentifier::SynIdentifier(this,pLVar3,pLVar2,name_00);
    bVar1 = ParseContext::Consume(ctx,lex_colon);
    if (bVar1) {
      value_1 = ParseAssignment(ctx);
      if (value_1 == (SynBase *)0x0) {
        pLVar3 = ParseContext::Current(ctx);
        anon_unknown.dwarf_11716f::Report
                  (ctx,pLVar3,"ERROR: expression not found after \':\' in function argument list");
        value_1 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar3 = ParseContext::Current(ctx);
        pLVar2 = ParseContext::Current(ctx);
        SynError::SynError((SynError *)value_1,pLVar3,pLVar2);
      }
      this_00 = ParseContext::get<SynCallArgument>(ctx);
      pLVar3 = ParseContext::Previous(ctx);
      SynCallArgument::SynCallArgument(this_00,begin,pLVar3,this,value_1);
      return this_00;
    }
    ctx->currentLexeme = begin;
  }
  value_00 = ParseAssignment(ctx);
  if (value_00 == (SynBase *)0x0) {
    ctx_local = (ParseContext *)0x0;
  }
  else {
    ctx_local = (ParseContext *)ParseContext::get<SynCallArgument>(ctx);
    pLVar3 = ParseContext::Previous(ctx);
    SynCallArgument::SynCallArgument
              ((SynCallArgument *)ctx_local,begin,pLVar3,(SynIdentifier *)0x0,value_00);
  }
  return (SynCallArgument *)ctx_local;
}

Assistant:

SynCallArgument* ParseCallArgument(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_string))
	{
		InplaceStr name = ctx.Consume();
		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

		if(ctx.Consume(lex_colon))
		{
			SynBase *value = ParseAssignment(ctx);

			if(!value)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after ':' in function argument list");

				value = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			return new (ctx.get<SynCallArgument>()) SynCallArgument(start, ctx.Previous(), nameIdentifier, value);
		}
		else
		{
			// Backtrack
			ctx.currentLexeme = start;
		}
	}

	if(SynBase *value = ParseAssignment(ctx))
	{
		return new (ctx.get<SynCallArgument>()) SynCallArgument(start, ctx.Previous(), NULL, value);
	}

	return NULL;
}